

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O2

void worker(void)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = next_worker_id;
  uVar3 = (next_worker_id * 0x11) % 0xb + 0xd;
  uVar2 = (ulong)(uint)next_worker_id;
  next_worker_id = next_worker_id + 1;
  fprintf((FILE *)out,"[Worker %d] started, work=%d\n",uVar2,(ulong)uVar3);
  uVar4 = 0x2a;
  while ((the_thread->sched->shutdown_signal == false && (0 < (int)uVar3))) {
    uVar3 = uVar3 - 1;
    uVar4 = ((uVar4 ^ uVar3) << 0xd | (uVar4 ^ uVar3) >> 0x13) * 0x539;
    yield();
  }
  fprintf((FILE *)out,"[Worker %d] exiting, result: %u\n",(ulong)(uint)iVar1,(ulong)uVar4);
  return;
}

Assistant:

static void
worker(void)
{
    int my_id = next_worker_id++;
    int work = 13 + ((my_id * 17) % 11);
    unsigned h = 42;
    fprintf(out, "[Worker %d] started, work=%d\n", my_id, work);
    while (!shutting_down() && work-- > 0) {
        h ^= (unsigned) work;
        h = (h << 13) | (h >> 19);
        h *= 1337;
        yield();
    }
    fprintf(out, "[Worker %d] exiting, result: %u\n", my_id, h);
}